

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O1

void __thiscall
PosTagger_TestUserDict_Test::~PosTagger_TestUserDict_Test(PosTagger_TestUserDict_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PosTagger, TestUserDict) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8", "../test/testdata/userdict.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST2, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST2);
  }
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST3, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST3);
  }
}